

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O3

string * compose_owerflow_err_msg_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  char local_1a1;
  double local_1a0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  local_1a0 = d;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"integer ",8);
  pcVar2 = "underflow";
  if (2147483647.0 < local_1a0) {
    pcVar2 = "owerflow";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,pcVar2,(ulong)(2147483647.0 < local_1a0) ^ 9);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,". Calculator can work with integers in range [",0x2e);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,-0x80000000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7fffffff);
  local_1a1 = ']';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a1,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

string compose_owerflow_err_msg(double d)
{
	stringstream ss;
	ss << "integer "
		<< (d > INT32_MAX ? "owerflow" : "underflow")
		<< ". Calculator can work with integers in range ["
		<< INT32_MIN
		<< ", "
		<< INT32_MAX
		<< ']';
	return ss.str();
}